

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  lua_Number num;
  lua_Integer res;
  TValue *o;
  TValue n;
  int idx_local;
  lua_State *L_local;
  
  n._12_4_ = idx;
  res = (lua_Integer)index2adr(L,idx);
  if ((((TValue *)res)->tt != 3) &&
     (res = (lua_Integer)luaV_tonumber((TValue *)res,(TValue *)&o), (TValue *)res == (TValue *)0x0))
  {
    return 0;
  }
  return (long)*(double *)res;
}

Assistant:

static lua_Integer lua_tointeger(lua_State*L,int idx){
TValue n;
const TValue*o=index2adr(L,idx);
if(tonumber(o,&n)){
lua_Integer res;
lua_Number num=nvalue(o);
lua_number2integer(res,num);
return res;
}
else
return 0;
}